

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitagg.cpp
# Opt level: O3

void duckdb::BitwiseOperation::Combine<duckdb::BitState<duckdb::uhugeint_t>,duckdb::BitAndOperation>
               (BitState<duckdb::uhugeint_t> *source,BitState<duckdb::uhugeint_t> *target,
               AggregateInputData *param_3)

{
  uhugeint_t local_10;
  
  if (source->is_set == true) {
    local_10.lower = (source->value).lower;
    local_10.upper = (source->value).upper;
    if (target->is_set == false) {
      (target->value).lower = local_10.lower;
      (target->value).upper = local_10.upper;
      target->is_set = true;
      return;
    }
    uhugeint_t::operator&=(&target->value,&local_10);
  }
  return;
}

Assistant:

static void Combine(const STATE &source, STATE &target, AggregateInputData &) {
		if (!source.is_set) {
			// source is NULL, nothing to do.
			return;
		}
		if (!target.is_set) {
			// target is NULL, use source value directly.
			OP::template Assign<typename STATE::TYPE>(target, source.value);
			target.is_set = true;
		} else {
			OP::template Execute<typename STATE::TYPE>(target, source.value);
		}
	}